

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O1

void __thiscall ncnn::Convolution_x86_avx512::destroy_pipeline(Convolution_x86_avx512 *this)

{
  Option *in_RSI;
  
  destroy_pipeline((Convolution_x86_avx512 *)
                   ((long)&this->_vptr_Convolution_x86_avx512 +
                   (long)this->_vptr_Convolution_x86_avx512[-7]),in_RSI);
  return;
}

Assistant:

int Convolution_x86_avx512::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    if (convolution_dilation1)
    {
        convolution_dilation1->destroy_pipeline(opt);
        delete convolution_dilation1;
        convolution_dilation1 = 0;
    }

    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}